

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataWriterClient.cpp
# Opt level: O1

void __thiscall DataWriterClient::openClient(DataWriterClient *this)

{
  long lVar1;
  int __fd;
  int iVar2;
  hostent *phVar3;
  const_iterator cVar4;
  iterator iVar5;
  iterator iVar6;
  long *plVar7;
  undefined8 *puVar8;
  size_t __n;
  undefined8 uVar9;
  ulong *puVar10;
  size_type *psVar11;
  DataVars *this_00;
  ulong uVar12;
  ushort uVar13;
  char local_568 [8];
  char buffer [1024];
  char buffer_ip [26];
  ushort uStack_146;
  undefined1 auStack_144 [4];
  sockaddr_in serv_addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined8 local_110;
  undefined1 local_108 [8];
  string varName;
  long local_e0;
  ulong local_d8;
  undefined1 local_c8 [8];
  string setCommand;
  undefined1 local_90 [8];
  string bindStr;
  ulong local_60;
  long lStack_58;
  long *local_50;
  undefined8 local_48;
  long local_40;
  undefined8 uStack_38;
  
  stack0xfffffffffffffeb8 = 0;
  serv_addr.sin_family = 0;
  serv_addr.sin_port = 0;
  serv_addr.sin_addr.s_addr = 0;
  iVar2 = this->port;
  __fd = socket(2,1,0);
  if (__fd < 0) {
    perror("ERROR opening socket");
    return;
  }
  strcpy(buffer + 0x3f8,(this->ip)._M_dataplus._M_p);
  phVar3 = gethostbyname(buffer + 0x3f8);
  if (phVar3 == (hostent *)0x0) {
    openClient();
  }
  else {
    serv_addr.sin_family = 0;
    serv_addr.sin_port = 0;
    serv_addr.sin_addr.s_addr = 0;
    stack0xfffffffffffffeb8 = 2;
    memmove(auStack_144,*phVar3->h_addr_list,(long)phVar3->h_length);
    uVar13 = (ushort)iVar2;
    stack0xfffffffffffffeb8 = CONCAT22(uVar13 << 8 | uVar13 >> 8,buffer_ip._24_2_);
    iVar2 = connect(__fd,(sockaddr *)(buffer_ip + 0x18),0x10);
    if (-1 < iVar2) {
      while( true ) {
        this_00 = this->dataVars;
        if (this_00->isChanged == false) {
          do {
            usleep(5000);
            this_00 = this->dataVars;
          } while (this_00->isChanged != true);
        }
        DataVars::getLastChanged_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c8,this_00);
        if ((undefined1  [8])setCommand._M_dataplus._M_p == local_c8) break;
        local_108 = (undefined1  [8])&varName._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_108,*(size_type *)local_c8,
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_c8 + 8))->_M_allocated_capacity + *(size_type *)local_c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c8);
        DataVars::deleteFirstElementFromLastChanged(this->dataVars);
        DataBinds::getVarToNameInSimulator_abi_cxx11_
                  ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_c8,this->dataBinds);
        cVar4 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)local_c8,(key_type *)local_108);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_c8);
        if (cVar4.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          DataVars::getSymbolTable_abi_cxx11_
                    ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      *)local_c8,this->dataVars);
          iVar5 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_c8,(key_type *)local_108);
          if (iVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_0011c924;
          local_110 = *(undefined8 *)
                       ((long)iVar5.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                              ._M_cur + 0x28);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_c8);
          local_90 = (undefined1  [8])&bindStr._M_string_length;
          bindStr._M_dataplus._M_p = (pointer)0x0;
          bindStr._M_string_length._0_1_ = 0;
          DataBinds::getVarToNameInSimulator_abi_cxx11_
                    ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_c8,this->dataBinds);
          cVar4 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_c8,(key_type *)local_108);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_c8);
          if (cVar4.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            DataBinds::getVarToNameInSimulator_abi_cxx11_
                      ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_c8,this->dataBinds);
            iVar6 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)local_c8,(key_type *)local_108);
            if (iVar6.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur == (__node_type *)0x0) goto LAB_0011c930;
            std::__cxx11::string::_M_assign((string *)local_90);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_c8);
          }
          if (bindStr._M_dataplus._M_p != (pointer)0x0) {
            std::__cxx11::string::substr((ulong)local_c8,(ulong)local_90);
            std::__cxx11::string::operator=((string *)local_90,(string *)local_c8);
            if (local_c8 != (undefined1  [8])&setCommand._M_string_length) {
              operator_delete((void *)local_c8,setCommand._M_string_length + 1);
            }
            std::operator+(&local_130,"set ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_90);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_130);
            bindStr.field_2._8_8_ = &local_60;
            puVar10 = (ulong *)(plVar7 + 2);
            if ((ulong *)*plVar7 == puVar10) {
              local_60 = *puVar10;
              lStack_58 = plVar7[3];
            }
            else {
              local_60 = *puVar10;
              bindStr.field_2._8_8_ = (ulong *)*plVar7;
            }
            lVar1 = plVar7[1];
            *plVar7 = (long)puVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&varName.field_2 + 8),vsnprintf,0x148,"%f",(int)local_110);
            uVar12 = 0xf;
            if ((ulong *)bindStr.field_2._8_8_ != &local_60) {
              uVar12 = local_60;
            }
            if (uVar12 < (ulong)(local_e0 + lVar1)) {
              uVar12 = 0xf;
              if ((ulong *)varName.field_2._8_8_ != &stack0xffffffffffffff28) {
                uVar12 = local_d8;
              }
              if (uVar12 < (ulong)(local_e0 + lVar1)) goto LAB_0011c731;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)((long)&varName.field_2 + 8),0,(char *)0x0,
                                  bindStr.field_2._8_8_);
            }
            else {
LAB_0011c731:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 (bindStr.field_2._M_local_buf + 8,varName.field_2._8_8_);
            }
            local_50 = &local_40;
            plVar7 = puVar8 + 2;
            if ((long *)*puVar8 == plVar7) {
              local_40 = *plVar7;
              uStack_38 = puVar8[3];
            }
            else {
              local_40 = *plVar7;
              local_50 = (long *)*puVar8;
            }
            local_48 = puVar8[1];
            *puVar8 = plVar7;
            puVar8[1] = 0;
            *(undefined1 *)plVar7 = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
            local_c8 = (undefined1  [8])&setCommand._M_string_length;
            psVar11 = puVar8 + 2;
            if ((size_type *)*puVar8 == psVar11) {
              setCommand._M_string_length = *psVar11;
              setCommand.field_2._M_allocated_capacity = puVar8[3];
            }
            else {
              setCommand._M_string_length = *psVar11;
              local_c8 = (undefined1  [8])*puVar8;
            }
            setCommand._M_dataplus._M_p = (pointer)puVar8[1];
            *puVar8 = psVar11;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            if (local_50 != &local_40) {
              operator_delete(local_50,local_40 + 1);
            }
            if ((ulong *)varName.field_2._8_8_ != &stack0xffffffffffffff28) {
              operator_delete((void *)varName.field_2._8_8_,local_d8 + 1);
            }
            if ((ulong *)bindStr.field_2._8_8_ != &local_60) {
              operator_delete((void *)bindStr.field_2._8_8_,local_60 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            memset(local_568,0,0x400);
            strcpy(local_568,(char *)local_c8);
            __n = strlen(local_568);
            send(__fd,local_568,__n,0);
            if (local_c8 != (undefined1  [8])&setCommand._M_string_length) {
              operator_delete((void *)local_c8,setCommand._M_string_length + 1);
            }
          }
          if (local_90 != (undefined1  [8])&bindStr._M_string_length) {
            operator_delete((void *)local_90,
                            CONCAT71(bindStr._M_string_length._1_7_,
                                     (undefined1)bindStr._M_string_length) + 1);
          }
        }
        if (local_108 != (undefined1  [8])&varName._M_string_length) {
          operator_delete((void *)local_108,varName._M_string_length + 1);
        }
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0011c924:
      std::__throw_out_of_range("_Map_base::at");
LAB_0011c930:
      uVar9 = std::__throw_out_of_range("_Map_base::at");
      if (local_c8 != (undefined1  [8])&setCommand._M_string_length) {
        operator_delete((void *)local_c8,setCommand._M_string_length + 1);
      }
      if (local_90 != (undefined1  [8])&bindStr._M_string_length) {
        operator_delete((void *)local_90,
                        CONCAT71(bindStr._M_string_length._1_7_,(undefined1)bindStr._M_string_length
                                ) + 1);
      }
      if (local_108 != (undefined1  [8])&varName._M_string_length) {
        operator_delete((void *)local_108,varName._M_string_length + 1);
      }
      _Unwind_Resume(uVar9);
    }
    perror("ERROR connecting");
  }
  return;
}

Assistant:

void DataWriterClient::openClient() {
    int sockfd, portno;
    struct sockaddr_in serv_addr{};
    struct hostent *server;
    char buffer[1024];
    portno = this->port;

    // Create a socket point
    sockfd = socket(AF_INET, SOCK_STREAM, 0);
    if (sockfd < 0) {
        perror("ERROR opening socket");
        return;
    }
    char buffer_ip[26];
    strcpy(buffer_ip, ip.c_str());
    server = gethostbyname(buffer_ip);

    if (server == nullptr) {
        fprintf(stderr, "ERROR, no such host\n");
        return;
    }
    bzero((char *) &serv_addr, sizeof(serv_addr));
    serv_addr.sin_family = AF_INET;
    bcopy(server->h_addr, (char *) &serv_addr.sin_addr.s_addr, static_cast<size_t>(server->h_length));
    serv_addr.sin_port = htons(static_cast<uint16_t>(portno));

    // Now connect to the server
    if (connect(sockfd, (struct sockaddr *) &serv_addr, sizeof(serv_addr)) < 0) {
        perror("ERROR connecting");
        return;
    }

    while (true) {
        while (!dataVars->isChanged) {
            usleep(5000);
        }

        string varName = this->dataVars->getLastChanged().at(0);
        // delete first element

        this->dataVars->deleteFirstElementFromLastChanged();

        // Find the value of the var
        double varValue = 0;
        if (this->dataBinds->getVarToNameInSimulator().count(varName) >= 1) {
            varValue = this->dataVars->getSymbolTable().at(varName);
        } else {
            continue;
        }
        // Find the name of the var according to how it appears in the simulator
        string bindStr;
        if (this->dataBinds->getVarToNameInSimulator().count(varName) == 1) {
            bindStr = this->dataBinds->getVarToNameInSimulator().at(varName);
        }
        //local variable- not found in binds
        if (bindStr.empty()) {
            continue;
        }
        // Create an appropriate set command
        bindStr = bindStr.substr(1, bindStr.length() - 2);
        string setCommand = "set " + bindStr + " " + to_string(varValue) + " \r\n";
        bzero(buffer, 1024);

        strcpy(buffer, setCommand.c_str());
        send(sockfd, buffer, strlen(buffer), 0);
    }
}